

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDependencyManager::AddGeneratedColumn
          (ColumnDependencyManager *this,LogicalIndex index,
          vector<duckdb::LogicalIndex,_true> *indices,bool root)

{
  pointer pLVar1;
  bool bVar2;
  _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var3;
  mapped_type *pmVar4;
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_01;
  size_type sVar5;
  InvalidInputException *this_02;
  LogicalIndex *dep;
  pointer __v;
  __node_base *p_Var6;
  allocator local_81;
  LogicalIndex index_local;
  string local_50;
  
  if ((indices->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (indices->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    index_local = index;
    this_00 = (_Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)::std::__detail::
                 _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->dependents_map,&index_local);
    pLVar1 = (indices->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (__v = (indices->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
               super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_start; __v != pLVar1; __v = __v + 1) {
      ::std::__detail::
      _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert(this_00,__v);
      p_Var3 = (_Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)::std::__detail::
                  _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,__v);
      ::std::__detail::
      _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert(p_Var3,&index_local);
      bVar2 = HasDependencies(this,(LogicalIndex)__v->index);
      if (bVar2) {
        pmVar4 = ::std::__detail::
                 _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->dependents_map,__v);
        p_Var6 = &(pmVar4->_M_h)._M_before_begin;
        while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
          ::std::__detail::
          _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert(this_00,(value_type *)(p_Var6 + 1));
          p_Var3 = (_Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)::std::__detail::
                      _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,(key_type *)(p_Var6 + 1));
          ::std::__detail::
          _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert(p_Var3,&index_local);
        }
      }
      if (root) {
        p_Var3 = (_Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)::std::__detail::
                    _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->direct_dependencies,&index_local);
        ::std::__detail::
        _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert(p_Var3,__v);
      }
    }
    bVar2 = HasDependents(this,index_local);
    if (bVar2) {
      this_01 = &::std::__detail::
                 _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&index_local)->_M_h;
      sVar5 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(this_01,&index_local);
      if (sVar5 != 0) {
        this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Circular dependency encountered when resolving generated column expressions",
                   &local_81);
        InvalidInputException::InvalidInputException(this_02,&local_50);
        __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      p_Var6 = &this_01->_M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        AddGeneratedColumn(this,(LogicalIndex)p_Var6[1]._M_nxt,indices,false);
      }
    }
  }
  return;
}

Assistant:

void ColumnDependencyManager::AddGeneratedColumn(LogicalIndex index, const vector<LogicalIndex> &indices, bool root) {
	if (indices.empty()) {
		return;
	}
	auto &list = dependents_map[index];
	// Create a link between the dependencies
	for (auto &dep : indices) {
		// Add this column as a dependency of the new column
		list.insert(dep);
		// Add the new column as a dependent of the column
		dependencies_map[dep].insert(index);
		// Inherit the dependencies
		if (HasDependencies(dep)) {
			auto &inherited_deps = dependents_map[dep];
			D_ASSERT(!inherited_deps.empty());
			for (auto &inherited_dep : inherited_deps) {
				list.insert(inherited_dep);
				dependencies_map[inherited_dep].insert(index);
			}
		}
		if (!root) {
			continue;
		}
		direct_dependencies[index].insert(dep);
	}
	if (!HasDependents(index)) {
		return;
	}
	auto &dependents = dependencies_map[index];
	if (dependents.count(index)) {
		throw InvalidInputException("Circular dependency encountered when resolving generated column expressions");
	}
	// Also let the dependents of this generated column inherit the dependencies
	for (auto &dependent : dependents) {
		AddGeneratedColumn(dependent, indices, false);
	}
}